

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# op_helper.c
# Opt level: O0

uint32_t helper_msub32_suov(CPUTriCoreState *env,target_ulong_conflict r1,target_ulong_conflict r2,
                           target_ulong_conflict r3)

{
  uint64_t uVar1;
  uint64_t uVar2;
  uint64_t uVar3;
  uint64_t mul;
  uint64_t result;
  uint64_t t3;
  uint64_t t2;
  uint64_t t1;
  target_ulong_conflict r3_local;
  target_ulong_conflict r2_local;
  target_ulong_conflict r1_local;
  CPUTriCoreState *env_local;
  
  uVar1 = extract64((ulong)r1,0,0x20);
  uVar2 = extract64((ulong)r2,0,0x20);
  uVar3 = extract64((ulong)r3,0,0x20);
  mul._0_4_ = (int)uVar2 - (int)(uVar1 * uVar3);
  env->PSW_USB_AV = (uint)mul ^ (uint)mul * 2;
  env->PSW_USB_SAV = env->PSW_USB_AV | env->PSW_USB_SAV;
  if (uVar2 < uVar1 * uVar3) {
    env->PSW_USB_V = 0x80000000;
    env->PSW_USB_SV = 0x80000000;
    mul._0_4_ = 0;
  }
  else {
    env->PSW_USB_V = 0;
  }
  return (uint)mul;
}

Assistant:

target_ulong helper_msub32_suov(CPUTriCoreState *env, target_ulong r1,
                                target_ulong r2, target_ulong r3)
{
    uint64_t t1 = extract64(r1, 0, 32);
    uint64_t t2 = extract64(r2, 0, 32);
    uint64_t t3 = extract64(r3, 0, 32);
    uint64_t result;
    uint64_t mul;

    mul = (t1 * t3);
    result = t2 - mul;

    env->PSW_USB_AV = result ^ result * 2u;
    env->PSW_USB_SAV |= env->PSW_USB_AV;
    /* we calculate ovf by hand here, because the multiplication can overflow on
       the host, which would give false results if we compare to less than
       zero */
    if (mul > t2) {
        env->PSW_USB_V = (1 << 31);
        env->PSW_USB_SV = (1 << 31);
        result = 0;
    } else {
        env->PSW_USB_V = 0;
    }
    return result;
}